

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_ctor_and_move_unit_test.cpp
# Opt level: O0

void print_simplex_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>
               (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *st,string *msg)

{
  bool bVar1;
  type_conflict4 tVar2;
  int iVar3;
  reference rVar4;
  ostream *poVar5;
  size_t sVar6;
  Filtration_simplex_range *this;
  reference other;
  Filtration_value *pFVar7;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  SVar8;
  int vertex;
  Siblings *local_d8;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __end0_1;
  Siblings *local_b8;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __begin0_1;
  iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
  local_a0;
  iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
  *local_80;
  Simplex_vertex_range *__range2;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_68;
  string local_60;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_40;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  f_simplex;
  const_iterator __end0;
  const_iterator __begin0;
  Filtration_simplex_range *__range1;
  string *msg_local;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *st_local;
  
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::initialize_filtration(st,false)
  ;
  std::operator<<((ostream *)&std::clog,
                  "********************************************************************\n");
  poVar5 = std::operator<<((ostream *)&std::clog,"* ");
  poVar5 = std::operator<<(poVar5,(string *)msg);
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<((ostream *)&std::clog,"* The complex contains ");
  sVar6 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::num_simplices(st);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
  std::operator<<(poVar5," simplices");
  poVar5 = std::operator<<((ostream *)&std::clog,"   - dimension ");
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::dimension(st);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  std::operator<<(poVar5,"\n");
  std::operator<<((ostream *)&std::clog,
                  "* Iterator on Simplices in the filtration, with [filtration value]:\n");
  this = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::filtration_simplex_range
                   (st);
  __end0 = std::
           vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
           ::begin(this);
  f_simplex.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
        *)std::
          vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
          ::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>_>
                                *)&f_simplex);
    if (!bVar1) break;
    other = __gnu_cxx::
            __normal_iterator<const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>_>
            ::operator*(&__end0);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator(&local_40,other);
    poVar5 = std::operator<<((ostream *)&std::clog,"   ");
    poVar5 = std::operator<<(poVar5,"[");
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator(&local_68,&local_40);
    pFVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::filtration
                       (&local_68);
    print_filtration_value_abi_cxx11_(&local_60,(double)*pFVar7);
    poVar5 = std::operator<<(poVar5,(string *)&local_60);
    std::operator<<(poVar5,"] ");
    std::__cxx11::string::~string((string *)&local_60);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                    *)&__begin0_1.v_,&local_40);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::simplex_vertex_range
              ((Simplex_vertex_range *)&local_a0,st,(Simplex_handle *)&__begin0_1.v_);
    local_80 = &local_a0;
    SVar8 = boost::iterator_range_detail::
            iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
            ::begin(&local_a0);
    __end0_1._8_8_ = SVar8.sib_;
    __begin0_1.sib_._0_4_ = SVar8.v_;
    local_b8 = (Siblings *)__end0_1._8_8_;
    SVar8 = boost::iterator_range_detail::
            iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
            ::end(local_80);
    local_d8 = SVar8.sib_;
    __end0_1.sib_._0_4_ = SVar8.v_;
    while( true ) {
      tVar2 = boost::iterators::operator!=
                        ((iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                          *)&local_b8,
                         (iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                          *)&local_d8);
      if (!tVar2) break;
      rVar4 = boost::iterators::detail::
              iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
              ::operator*((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                           *)&local_b8);
      poVar5 = std::operator<<((ostream *)&std::clog,"(");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar4);
      std::operator<<(poVar5,")");
      boost::iterators::detail::
      iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
      ::operator++((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                    *)&local_b8);
    }
    std::ostream::operator<<(&std::clog,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void print_simplex_filtration(const Simplex_tree& st, const std::string& msg) {
  // Required before browsing through filtration values
  st.initialize_filtration();

  std::clog << "********************************************************************\n";
  std::clog << "* " << msg << "\n";
  std::clog << "* The complex contains " << st.num_simplices() << " simplices";
  std::clog << "   - dimension " << st.dimension() << "\n";
  std::clog << "* Iterator on Simplices in the filtration, with [filtration value]:\n";
  for (auto f_simplex : st.filtration_simplex_range()) {
    std::clog << "   "
              << "[" << print_filtration_value(st.filtration(f_simplex)) << "] ";
    for (auto vertex : st.simplex_vertex_range(f_simplex)) std::clog << "(" << vertex << ")";
    std::clog << std::endl;
  }

}